

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O2

void transpose_16bit_16x16_avx2(__m256i *in,__m256i *out)

{
  longlong local_240;
  longlong lStack_238;
  longlong local_230;
  longlong lStack_228;
  longlong local_220;
  longlong lStack_218;
  longlong local_210;
  longlong lStack_208;
  longlong local_200;
  longlong lStack_1f8;
  longlong local_1f0;
  longlong lStack_1e8;
  longlong local_1e0;
  longlong lStack_1d8;
  longlong local_1d0;
  longlong lStack_1c8;
  longlong local_1c0;
  longlong lStack_1b8;
  longlong local_1b0;
  longlong lStack_1a8;
  longlong local_1a0;
  longlong lStack_198;
  longlong local_190;
  longlong lStack_188;
  longlong local_180;
  longlong lStack_178;
  longlong local_170;
  longlong lStack_168;
  longlong local_160;
  longlong lStack_158;
  longlong local_150;
  longlong lStack_148;
  longlong local_140;
  longlong lStack_138;
  longlong local_130;
  longlong lStack_128;
  longlong local_120;
  longlong lStack_118;
  longlong local_110;
  longlong lStack_108;
  longlong local_100;
  longlong lStack_f8;
  longlong local_f0;
  longlong lStack_e8;
  longlong local_e0;
  longlong lStack_d8;
  longlong local_d0;
  longlong lStack_c8;
  longlong local_c0;
  longlong lStack_b8;
  longlong local_b0;
  longlong lStack_a8;
  longlong local_a0;
  longlong lStack_98;
  longlong local_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong local_70;
  longlong lStack_68;
  longlong local_60;
  longlong lStack_58;
  longlong local_50;
  longlong lStack_48;
  
  local_240 = (*in)[0];
  lStack_238 = (*in)[1];
  local_230 = in[8][0];
  lStack_228 = in[8][1];
  local_220 = in[1][0];
  lStack_218 = in[1][1];
  local_210 = in[9][0];
  lStack_208 = in[9][1];
  local_200 = in[2][0];
  lStack_1f8 = in[2][1];
  local_1f0 = in[10][0];
  lStack_1e8 = in[10][1];
  local_1e0 = in[3][0];
  lStack_1d8 = in[3][1];
  local_1d0 = in[0xb][0];
  lStack_1c8 = in[0xb][1];
  local_1c0 = in[4][0];
  lStack_1b8 = in[4][1];
  local_1b0 = in[0xc][0];
  lStack_1a8 = in[0xc][1];
  local_1a0 = in[5][0];
  lStack_198 = in[5][1];
  local_190 = in[0xd][0];
  lStack_188 = in[0xd][1];
  local_180 = in[6][0];
  lStack_178 = in[6][1];
  local_170 = in[0xe][0];
  lStack_168 = in[0xe][1];
  local_160 = in[7][0];
  lStack_158 = in[7][1];
  local_150 = in[0xf][0];
  lStack_148 = in[0xf][1];
  local_140 = (*in)[2];
  lStack_138 = (*in)[3];
  local_130 = in[8][2];
  lStack_128 = in[8][3];
  local_120 = in[1][2];
  lStack_118 = in[1][3];
  local_110 = in[9][2];
  lStack_108 = in[9][3];
  local_100 = in[2][2];
  lStack_f8 = in[2][3];
  local_f0 = in[10][2];
  lStack_e8 = in[10][3];
  local_e0 = in[3][2];
  lStack_d8 = in[3][3];
  local_d0 = in[0xb][2];
  lStack_c8 = in[0xb][3];
  local_c0 = in[4][2];
  lStack_b8 = in[4][3];
  local_b0 = in[0xc][2];
  lStack_a8 = in[0xc][3];
  local_a0 = in[5][2];
  lStack_98 = in[5][3];
  local_90 = in[0xd][2];
  lStack_88 = in[0xd][3];
  local_80 = in[6][2];
  lStack_78 = in[6][3];
  local_70 = in[0xe][2];
  lStack_68 = in[0xe][3];
  local_60 = in[7][2];
  lStack_58 = in[7][3];
  local_50 = in[0xf][2];
  lStack_48 = in[0xf][3];
  transpose2_8x8_avx2((__m256i *)&local_240,out);
  transpose2_8x8_avx2((__m256i *)&local_140,out + 8);
  return;
}

Assistant:

static inline void transpose_16bit_16x16_avx2(const __m256i *const in,
                                              __m256i *const out) {
  __m256i t[16];

#define LOADL(idx)                                                            \
  t[idx] = _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx])); \
  t[idx] = _mm256_inserti128_si256(                                           \
      t[idx], _mm_load_si128((__m128i const *)&in[idx + 8]), 1);

#define LOADR(idx)                                                           \
  t[8 + idx] =                                                               \
      _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx] + 1)); \
  t[8 + idx] = _mm256_inserti128_si256(                                      \
      t[8 + idx], _mm_load_si128((__m128i const *)&in[idx + 8] + 1), 1);

  // load left 8x16
  LOADL(0)
  LOADL(1)
  LOADL(2)
  LOADL(3)
  LOADL(4)
  LOADL(5)
  LOADL(6)
  LOADL(7)

  // load right 8x16
  LOADR(0)
  LOADR(1)
  LOADR(2)
  LOADR(3)
  LOADR(4)
  LOADR(5)
  LOADR(6)
  LOADR(7)

  // get the top 16x8 result
  transpose2_8x8_avx2(t, out);
  // get the bottom 16x8 result
  transpose2_8x8_avx2(&t[8], &out[8]);
}